

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BST.hpp
# Opt level: O0

vector<supermap::KeyValue<supermap::Key<128UL>,_supermap::ByteArray<4096UL>_>,_std::allocator<supermap::KeyValue<supermap::Key<128UL>,_supermap::ByteArray<4096UL>_>_>_>
* __thiscall
supermap::BST<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>::extract
          (BST<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long> *this)

{
  Key<128UL> key_;
  bool bVar1;
  long in_RSI;
  vector<supermap::KeyValue<supermap::Key<128UL>,_supermap::ByteArray<4096UL>_>,_std::allocator<supermap::KeyValue<supermap::Key<128UL>,_supermap::ByteArray<4096UL>_>_>_>
  *in_RDI;
  type *v;
  type *k;
  iterator __end0;
  iterator __begin0;
  map<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_std::less<supermap::Key<128UL>_>,_std::allocator<std::pair<const_supermap::Key<128UL>,_supermap::ByteArray<4096UL>_>_>_>
  *__range2;
  vector<supermap::KeyValue<supermap::Key<128UL>,_supermap::ByteArray<4096UL>_>,_std::allocator<supermap::KeyValue<supermap::Key<128UL>,_supermap::ByteArray<4096UL>_>_>_>
  *extracted;
  map<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_std::less<supermap::Key<128UL>_>,_std::allocator<std::pair<const_supermap::Key<128UL>,_supermap::ByteArray<4096UL>_>_>_>
  *in_stack_fffffffffffffdd8;
  _Rb_tree_iterator<std::pair<const_supermap::Key<128UL>,_supermap::ByteArray<4096UL>_>_>
  *in_stack_fffffffffffffde0;
  KeyValue<supermap::Key<128UL>,_supermap::ByteArray<4096UL>_> *__args;
  KeyValue<supermap::Key<128UL>,_supermap::ByteArray<4096UL>_> *this_00;
  undefined8 in_stack_fffffffffffffe58;
  type *ptVar2;
  undefined1 *puVar3;
  vector<supermap::KeyValue<supermap::Key<128UL>,_supermap::ByteArray<4096UL>_>,_std::allocator<supermap::KeyValue<supermap::Key<128UL>,_supermap::ByteArray<4096UL>_>_>_>
  *pvVar4;
  undefined1 local_160 [8];
  map<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_std::less<supermap::Key<128UL>_>,_std::allocator<std::pair<const_supermap::Key<128UL>,_supermap::ByteArray<4096UL>_>_>_>
  *local_158;
  _Rb_tree_iterator<std::pair<const_supermap::Key<128UL>,_supermap::ByteArray<4096UL>_>_>
  *p_Stack_150;
  KeyValue<supermap::Key<128UL>,_supermap::ByteArray<4096UL>_> *local_148;
  KeyValue<supermap::Key<128UL>,_supermap::ByteArray<4096UL>_> *pKStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  type *local_48;
  type *local_40;
  reference local_38;
  _Self local_30;
  _Self local_28;
  long local_20;
  undefined1 local_11;
  
  local_11 = 0;
  pvVar4 = in_RDI;
  std::
  vector<supermap::KeyValue<supermap::Key<128UL>,_supermap::ByteArray<4096UL>_>,_std::allocator<supermap::KeyValue<supermap::Key<128UL>,_supermap::ByteArray<4096UL>_>_>_>
  ::vector((vector<supermap::KeyValue<supermap::Key<128UL>,_supermap::ByteArray<4096UL>_>,_std::allocator<supermap::KeyValue<supermap::Key<128UL>,_supermap::ByteArray<4096UL>_>_>_>
            *)0x2a6507);
  local_20 = in_RSI + 0x10;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_std::less<supermap::Key<128UL>_>,_std::allocator<std::pair<const_supermap::Key<128UL>,_supermap::ByteArray<4096UL>_>_>_>
       ::begin(in_stack_fffffffffffffdd8);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_std::less<supermap::Key<128UL>_>,_std::allocator<std::pair<const_supermap::Key<128UL>,_supermap::ByteArray<4096UL>_>_>_>
       ::end(in_stack_fffffffffffffdd8);
  while (bVar1 = std::operator!=(&local_28,&local_30), bVar1) {
    local_38 = std::
               _Rb_tree_iterator<std::pair<const_supermap::Key<128UL>,_supermap::ByteArray<4096UL>_>_>
               ::operator*(in_stack_fffffffffffffde0);
    local_40 = std::get<0ul,supermap::Key<128ul>const,supermap::ByteArray<4096ul>>
                         ((pair<const_supermap::Key<128UL>,_supermap::ByteArray<4096UL>_> *)0x2a6585
                         );
    local_48 = std::get<1ul,supermap::Key<128ul>const,supermap::ByteArray<4096ul>>
                         ((pair<const_supermap::Key<128UL>,_supermap::ByteArray<4096UL>_> *)0x2a659a
                         );
    local_e8 = *(undefined8 *)((local_40->super_array<unsigned_char,_128UL>)._M_elems + 0x70);
    uStack_e0 = *(undefined8 *)((local_40->super_array<unsigned_char,_128UL>)._M_elems + 0x78);
    local_f8 = *(undefined8 *)((local_40->super_array<unsigned_char,_128UL>)._M_elems + 0x60);
    uStack_f0 = *(undefined8 *)((local_40->super_array<unsigned_char,_128UL>)._M_elems + 0x68);
    local_108 = *(undefined8 *)((local_40->super_array<unsigned_char,_128UL>)._M_elems + 0x50);
    uStack_100 = *(undefined8 *)((local_40->super_array<unsigned_char,_128UL>)._M_elems + 0x58);
    local_118 = *(undefined8 *)((local_40->super_array<unsigned_char,_128UL>)._M_elems + 0x40);
    uStack_110 = *(undefined8 *)((local_40->super_array<unsigned_char,_128UL>)._M_elems + 0x48);
    local_158 = *(map<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_std::less<supermap::Key<128UL>_>,_std::allocator<std::pair<const_supermap::Key<128UL>,_supermap::ByteArray<4096UL>_>_>_>
                  **)(local_40->super_array<unsigned_char,_128UL>)._M_elems;
    p_Stack_150 = *(_Rb_tree_iterator<std::pair<const_supermap::Key<128UL>,_supermap::ByteArray<4096UL>_>_>
                    **)((local_40->super_array<unsigned_char,_128UL>)._M_elems + 8);
    local_148 = *(KeyValue<supermap::Key<128UL>,_supermap::ByteArray<4096UL>_> **)
                 ((local_40->super_array<unsigned_char,_128UL>)._M_elems + 0x10);
    pKStack_140 = *(KeyValue<supermap::Key<128UL>,_supermap::ByteArray<4096UL>_> **)
                   ((local_40->super_array<unsigned_char,_128UL>)._M_elems + 0x18);
    local_138 = *(undefined8 *)((local_40->super_array<unsigned_char,_128UL>)._M_elems + 0x20);
    uStack_130 = *(undefined8 *)((local_40->super_array<unsigned_char,_128UL>)._M_elems + 0x28);
    local_128 = *(undefined8 *)((local_40->super_array<unsigned_char,_128UL>)._M_elems + 0x30);
    uStack_120 = *(undefined8 *)((local_40->super_array<unsigned_char,_128UL>)._M_elems + 0x38);
    puVar3 = local_160;
    ptVar2 = local_40;
    ByteArray<4096UL>::ByteArray
              ((ByteArray<4096UL> *)in_stack_fffffffffffffde0,
               (ByteArray<4096UL> *)in_stack_fffffffffffffdd8);
    key_.super_array<unsigned_char,_128UL>._M_elems[8] = (undefined1)local_128;
    key_.super_array<unsigned_char,_128UL>._M_elems[9] = local_128._1_1_;
    key_.super_array<unsigned_char,_128UL>._M_elems[10] = local_128._2_1_;
    key_.super_array<unsigned_char,_128UL>._M_elems[0xb] = local_128._3_1_;
    key_.super_array<unsigned_char,_128UL>._M_elems[0xc] = local_128._4_1_;
    key_.super_array<unsigned_char,_128UL>._M_elems[0xd] = local_128._5_1_;
    key_.super_array<unsigned_char,_128UL>._M_elems[0xe] = local_128._6_1_;
    key_.super_array<unsigned_char,_128UL>._M_elems[0xf] = local_128._7_1_;
    key_.super_array<unsigned_char,_128UL>._M_elems[0] = (undefined1)uStack_130;
    key_.super_array<unsigned_char,_128UL>._M_elems[1] = uStack_130._1_1_;
    key_.super_array<unsigned_char,_128UL>._M_elems[2] = uStack_130._2_1_;
    key_.super_array<unsigned_char,_128UL>._M_elems[3] = uStack_130._3_1_;
    key_.super_array<unsigned_char,_128UL>._M_elems[4] = uStack_130._4_1_;
    key_.super_array<unsigned_char,_128UL>._M_elems[5] = uStack_130._5_1_;
    key_.super_array<unsigned_char,_128UL>._M_elems[6] = uStack_130._6_1_;
    key_.super_array<unsigned_char,_128UL>._M_elems[7] = uStack_130._7_1_;
    key_.super_array<unsigned_char,_128UL>._M_elems[0x10] = (undefined1)uStack_120;
    key_.super_array<unsigned_char,_128UL>._M_elems[0x11] = uStack_120._1_1_;
    key_.super_array<unsigned_char,_128UL>._M_elems[0x12] = uStack_120._2_1_;
    key_.super_array<unsigned_char,_128UL>._M_elems[0x13] = uStack_120._3_1_;
    key_.super_array<unsigned_char,_128UL>._M_elems[0x14] = uStack_120._4_1_;
    key_.super_array<unsigned_char,_128UL>._M_elems[0x15] = uStack_120._5_1_;
    key_.super_array<unsigned_char,_128UL>._M_elems[0x16] = uStack_120._6_1_;
    key_.super_array<unsigned_char,_128UL>._M_elems[0x17] = uStack_120._7_1_;
    key_.super_array<unsigned_char,_128UL>._M_elems[0x18] = (undefined1)local_118;
    key_.super_array<unsigned_char,_128UL>._M_elems[0x19] = local_118._1_1_;
    key_.super_array<unsigned_char,_128UL>._M_elems[0x1a] = local_118._2_1_;
    key_.super_array<unsigned_char,_128UL>._M_elems[0x1b] = local_118._3_1_;
    key_.super_array<unsigned_char,_128UL>._M_elems[0x1c] = local_118._4_1_;
    key_.super_array<unsigned_char,_128UL>._M_elems[0x1d] = local_118._5_1_;
    key_.super_array<unsigned_char,_128UL>._M_elems[0x1e] = local_118._6_1_;
    key_.super_array<unsigned_char,_128UL>._M_elems[0x1f] = local_118._7_1_;
    key_.super_array<unsigned_char,_128UL>._M_elems[0x20] = (undefined1)uStack_110;
    key_.super_array<unsigned_char,_128UL>._M_elems[0x21] = uStack_110._1_1_;
    key_.super_array<unsigned_char,_128UL>._M_elems[0x22] = uStack_110._2_1_;
    key_.super_array<unsigned_char,_128UL>._M_elems[0x23] = uStack_110._3_1_;
    key_.super_array<unsigned_char,_128UL>._M_elems[0x24] = uStack_110._4_1_;
    key_.super_array<unsigned_char,_128UL>._M_elems[0x25] = uStack_110._5_1_;
    key_.super_array<unsigned_char,_128UL>._M_elems[0x26] = uStack_110._6_1_;
    key_.super_array<unsigned_char,_128UL>._M_elems[0x27] = uStack_110._7_1_;
    key_.super_array<unsigned_char,_128UL>._M_elems[0x28] = (undefined1)local_108;
    key_.super_array<unsigned_char,_128UL>._M_elems[0x29] = local_108._1_1_;
    key_.super_array<unsigned_char,_128UL>._M_elems[0x2a] = local_108._2_1_;
    key_.super_array<unsigned_char,_128UL>._M_elems[0x2b] = local_108._3_1_;
    key_.super_array<unsigned_char,_128UL>._M_elems[0x2c] = local_108._4_1_;
    key_.super_array<unsigned_char,_128UL>._M_elems[0x2d] = local_108._5_1_;
    key_.super_array<unsigned_char,_128UL>._M_elems[0x2e] = local_108._6_1_;
    key_.super_array<unsigned_char,_128UL>._M_elems[0x2f] = local_108._7_1_;
    key_.super_array<unsigned_char,_128UL>._M_elems[0x30] = (undefined1)uStack_100;
    key_.super_array<unsigned_char,_128UL>._M_elems[0x31] = uStack_100._1_1_;
    key_.super_array<unsigned_char,_128UL>._M_elems[0x32] = uStack_100._2_1_;
    key_.super_array<unsigned_char,_128UL>._M_elems[0x33] = uStack_100._3_1_;
    key_.super_array<unsigned_char,_128UL>._M_elems[0x34] = uStack_100._4_1_;
    key_.super_array<unsigned_char,_128UL>._M_elems[0x35] = uStack_100._5_1_;
    key_.super_array<unsigned_char,_128UL>._M_elems[0x36] = uStack_100._6_1_;
    key_.super_array<unsigned_char,_128UL>._M_elems[0x37] = uStack_100._7_1_;
    key_.super_array<unsigned_char,_128UL>._M_elems[0x38] = (undefined1)local_f8;
    key_.super_array<unsigned_char,_128UL>._M_elems[0x39] = local_f8._1_1_;
    key_.super_array<unsigned_char,_128UL>._M_elems[0x3a] = local_f8._2_1_;
    key_.super_array<unsigned_char,_128UL>._M_elems[0x3b] = local_f8._3_1_;
    key_.super_array<unsigned_char,_128UL>._M_elems[0x3c] = local_f8._4_1_;
    key_.super_array<unsigned_char,_128UL>._M_elems[0x3d] = local_f8._5_1_;
    key_.super_array<unsigned_char,_128UL>._M_elems[0x3e] = local_f8._6_1_;
    key_.super_array<unsigned_char,_128UL>._M_elems[0x3f] = local_f8._7_1_;
    key_.super_array<unsigned_char,_128UL>._M_elems[0x40] = (undefined1)uStack_f0;
    key_.super_array<unsigned_char,_128UL>._M_elems[0x41] = uStack_f0._1_1_;
    key_.super_array<unsigned_char,_128UL>._M_elems[0x42] = uStack_f0._2_1_;
    key_.super_array<unsigned_char,_128UL>._M_elems[0x43] = uStack_f0._3_1_;
    key_.super_array<unsigned_char,_128UL>._M_elems[0x44] = uStack_f0._4_1_;
    key_.super_array<unsigned_char,_128UL>._M_elems[0x45] = uStack_f0._5_1_;
    key_.super_array<unsigned_char,_128UL>._M_elems[0x46] = uStack_f0._6_1_;
    key_.super_array<unsigned_char,_128UL>._M_elems[0x47] = uStack_f0._7_1_;
    key_.super_array<unsigned_char,_128UL>._M_elems[0x48] = (undefined1)local_e8;
    key_.super_array<unsigned_char,_128UL>._M_elems[0x49] = local_e8._1_1_;
    key_.super_array<unsigned_char,_128UL>._M_elems[0x4a] = local_e8._2_1_;
    key_.super_array<unsigned_char,_128UL>._M_elems[0x4b] = local_e8._3_1_;
    key_.super_array<unsigned_char,_128UL>._M_elems[0x4c] = local_e8._4_1_;
    key_.super_array<unsigned_char,_128UL>._M_elems[0x4d] = local_e8._5_1_;
    key_.super_array<unsigned_char,_128UL>._M_elems[0x4e] = local_e8._6_1_;
    key_.super_array<unsigned_char,_128UL>._M_elems[0x4f] = local_e8._7_1_;
    key_.super_array<unsigned_char,_128UL>._M_elems[0x50] = (undefined1)uStack_e0;
    key_.super_array<unsigned_char,_128UL>._M_elems[0x51] = uStack_e0._1_1_;
    key_.super_array<unsigned_char,_128UL>._M_elems[0x52] = uStack_e0._2_1_;
    key_.super_array<unsigned_char,_128UL>._M_elems[0x53] = uStack_e0._3_1_;
    key_.super_array<unsigned_char,_128UL>._M_elems[0x54] = uStack_e0._4_1_;
    key_.super_array<unsigned_char,_128UL>._M_elems[0x55] = uStack_e0._5_1_;
    key_.super_array<unsigned_char,_128UL>._M_elems[0x56] = uStack_e0._6_1_;
    key_.super_array<unsigned_char,_128UL>._M_elems[0x57] = uStack_e0._7_1_;
    key_.super_array<unsigned_char,_128UL>._M_elems[0x58] = (char)in_stack_fffffffffffffe58;
    key_.super_array<unsigned_char,_128UL>._M_elems[0x59] =
         (char)((ulong)in_stack_fffffffffffffe58 >> 8);
    key_.super_array<unsigned_char,_128UL>._M_elems[0x5a] =
         (char)((ulong)in_stack_fffffffffffffe58 >> 0x10);
    key_.super_array<unsigned_char,_128UL>._M_elems[0x5b] =
         (char)((ulong)in_stack_fffffffffffffe58 >> 0x18);
    key_.super_array<unsigned_char,_128UL>._M_elems[0x5c] =
         (char)((ulong)in_stack_fffffffffffffe58 >> 0x20);
    key_.super_array<unsigned_char,_128UL>._M_elems[0x5d] =
         (char)((ulong)in_stack_fffffffffffffe58 >> 0x28);
    key_.super_array<unsigned_char,_128UL>._M_elems[0x5e] =
         (char)((ulong)in_stack_fffffffffffffe58 >> 0x30);
    key_.super_array<unsigned_char,_128UL>._M_elems[0x5f] =
         (char)((ulong)in_stack_fffffffffffffe58 >> 0x38);
    key_.super_array<unsigned_char,_128UL>._M_elems._96_8_ = ptVar2;
    key_.super_array<unsigned_char,_128UL>._M_elems._104_8_ = puVar3;
    key_.super_array<unsigned_char,_128UL>._M_elems._112_8_ = &stack0xfffffffffffffdd8;
    key_.super_array<unsigned_char,_128UL>._M_elems._120_8_ = pvVar4;
    in_stack_fffffffffffffdd8 = local_158;
    in_stack_fffffffffffffde0 = p_Stack_150;
    __args = local_148;
    this_00 = pKStack_140;
    KeyValue<supermap::Key<128UL>,_supermap::ByteArray<4096UL>_>::KeyValue
              (pKStack_140,key_,(ByteArray<4096UL> *)local_148);
    std::
    vector<supermap::KeyValue<supermap::Key<128ul>,supermap::ByteArray<4096ul>>,std::allocator<supermap::KeyValue<supermap::Key<128ul>,supermap::ByteArray<4096ul>>>>
    ::emplace_back<supermap::KeyValue<supermap::Key<128ul>,supermap::ByteArray<4096ul>>>
              ((vector<supermap::KeyValue<supermap::Key<128UL>,_supermap::ByteArray<4096UL>_>,_std::allocator<supermap::KeyValue<supermap::Key<128UL>,_supermap::ByteArray<4096UL>_>_>_>
                *)this_00,__args);
    KeyValue<supermap::Key<128UL>,_supermap::ByteArray<4096UL>_>::~KeyValue
              ((KeyValue<supermap::Key<128UL>,_supermap::ByteArray<4096UL>_> *)0x2a66d3);
    ByteArray<4096UL>::~ByteArray((ByteArray<4096UL> *)0x2a66e0);
    std::_Rb_tree_iterator<std::pair<const_supermap::Key<128UL>,_supermap::ByteArray<4096UL>_>_>::
    operator++(in_stack_fffffffffffffde0);
  }
  std::
  map<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_std::less<supermap::Key<128UL>_>,_std::allocator<std::pair<const_supermap::Key<128UL>,_supermap::ByteArray<4096UL>_>_>_>
  ::clear((map<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_std::less<supermap::Key<128UL>_>,_std::allocator<std::pair<const_supermap::Key<128UL>,_supermap::ByteArray<4096UL>_>_>_>
           *)0x2a6756);
  return in_RDI;
}

Assistant:

std::vector<KeyValue<Key, Value>> extract() && override {
        std::vector<KeyValue<Key, Value>>
            extracted;
        for (auto &&[k, v] : map_) {
            extracted.emplace_back(KeyValue(std::move(k), std::move(v)));
        }
        map_.clear();
        return extracted;
    }